

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Type> * __thiscall
wasm::IRBuilder::getLabelType
          (Result<wasm::Type> *__return_storage_ptr__,IRBuilder *this,Name labelName)

{
  uint *puVar1;
  bool bVar2;
  Err local_c8;
  Err *local_a8;
  Err *err;
  undefined1 local_90 [8];
  Result<unsigned_int> _val;
  undefined1 local_50 [8];
  Result<unsigned_int> label;
  IRBuilder *this_local;
  Name labelName_local;
  
  _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = labelName.super_IString.str._M_len;
  label.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ = this;
  getLabelIndex((Result<unsigned_int> *)local_50,this,labelName,false);
  Result<unsigned_int>::Result((Result<unsigned_int> *)local_90,(Result<unsigned_int> *)local_50);
  local_a8 = Result<unsigned_int>::getErr((Result<unsigned_int> *)local_90);
  bVar2 = local_a8 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_c8,local_a8);
    Result<wasm::Type>::Result(__return_storage_ptr__,&local_c8);
    wasm::Err::~Err(&local_c8);
  }
  Result<unsigned_int>::~Result((Result<unsigned_int> *)local_90);
  if (bVar2) {
    puVar1 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_50);
    getLabelType(__return_storage_ptr__,this,*puVar1);
  }
  Result<unsigned_int>::~Result((Result<unsigned_int> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Result<Type> IRBuilder::getLabelType(Name labelName) {
  auto label = getLabelIndex(labelName);
  CHECK_ERR(label);
  return getLabelType(*label);
}